

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_0::ClassVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Descriptor *desc,Options *opts)

{
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  iterator iVar1;
  bool bVar2;
  Options *pOVar3;
  FileDescriptor *file;
  reference ppVar4;
  Options *in_RCX;
  Descriptor *desc_00;
  string_view sVar5;
  iterator iVar6;
  iterator iVar7;
  anon_union_8_1_a8a14541_for_iterator_2 local_e18;
  Sub *local_de8;
  allocator<char> local_cf9;
  string local_cf8;
  Sub local_cd8;
  reference local_c20;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_1;
  iterator __end3_1;
  iterator __begin3_1;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3_1;
  string local_bc8;
  Sub local_ba8;
  reference local_af0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end3;
  iterator __begin3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  string local_a98;
  byte local_a72;
  allocator<char> local_a71;
  AlphaNum local_a70;
  byte local_a39;
  string local_a38;
  AlphaNum local_a18;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  Sub local_9a0;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  basic_string_view<char,_std::char_traits<char>_> local_8a0;
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  basic_string_view<char,_std::char_traits<char>_> local_7d8;
  allocator<char> local_7c1;
  string local_7c0;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  string local_758;
  allocator<char> local_731;
  string local_730;
  string local_710;
  allocator<char> local_6d9;
  string local_6d8;
  Sub *local_6b8;
  Sub local_6b0;
  Sub local_5f8;
  Sub local_540;
  Sub local_488;
  Sub local_3d0;
  Sub local_318;
  Sub local_260;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  undefined1 local_21;
  undefined8 local_20;
  Options *opts_local;
  Descriptor *desc_local;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *vars;
  
  local_21 = '\0';
  __range3._6_1_ = 1;
  local_6b8 = &local_6b0;
  local_20 = opts;
  opts_local = (Options *)desc;
  desc_local = (Descriptor *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"pkg",&local_6d9);
  Namespace_abi_cxx11_(&local_710,(cpp *)opts_local,(Descriptor *)opts,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_6b0,&local_6d8,&local_710);
  local_6b8 = &local_5f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"Msg",&local_731);
  ClassName_abi_cxx11_(&local_758,(cpp *)opts_local,(Descriptor *)0x0,SUB81(in_RCX,0));
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_5f8,&local_730,&local_758);
  local_6b8 = &local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"pkg::Msg",&local_779);
  QualifiedClassName_abi_cxx11_(&local_7a0,(cpp *)opts_local,(Descriptor *)opts,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_540,&local_778,&local_7a0);
  local_6b8 = &local_488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"pkg.Msg",&local_7c1);
  sVar5 = Descriptor::full_name((Descriptor *)opts_local);
  local_7d8._M_str = sVar5._M_str;
  pOVar3 = (Options *)sVar5._M_len;
  local_7d8._M_len = (size_t)pOVar3;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_488,&local_7c0,&local_7d8);
  local_6b8 = &local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"classname",&local_7f9);
  ClassName_abi_cxx11_(&local_820,(cpp *)opts_local,(Descriptor *)0x0,SUB81(pOVar3,0));
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3d0,&local_7f8,&local_820);
  local_6b8 = &local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"classtype",&local_841);
  QualifiedClassName_abi_cxx11_(&local_868,(cpp *)opts_local,(Descriptor *)opts,pOVar3);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_318,&local_840,&local_868);
  local_6b8 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"full_name",&local_889);
  sVar5 = Descriptor::full_name((Descriptor *)opts_local);
  local_8a0._M_str = sVar5._M_str;
  pOVar3 = (Options *)sVar5._M_len;
  local_8a0._M_len = (size_t)pOVar3;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_260,&local_888,&local_8a0);
  local_6b8 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"superclass",&local_8c1);
  SuperClassName_abi_cxx11_(&local_8e8,(cpp *)opts_local,(Descriptor *)opts,pOVar3);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a8,&local_8c0,&local_8e8);
  local_6b8 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"WeakDescriptorSelfPin",&local_9c1);
  file = Descriptor::file((Descriptor *)opts_local);
  local_a39 = 0;
  local_a72 = 0;
  bVar2 = UsingImplicitWeakDescriptor(file,opts);
  if (bVar2) {
    StrongReferenceToType_abi_cxx11_(&local_a38,(cpp *)opts_local,(Descriptor *)opts,pOVar3);
    local_a39 = 1;
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_a18,&local_a38);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a70,";");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_9e8,(lts_20250127 *)&local_a18,&local_a70,(AlphaNum *)pOVar3);
  }
  else {
    std::allocator<char>::allocator();
    local_a72 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"",&local_a71);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_9a0,&local_9c0,&local_9e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,";",(allocator<char> *)((long)&__range3 + 7));
  io::Printer::Sub::WithSuffix(&local_f0,&local_9a0,&local_a98);
  __range3._6_1_ = 0;
  local_38 = &local_6b0;
  local_30 = 9;
  std::allocator<google::protobuf::io::Printer::Sub>::allocator
            ((allocator<google::protobuf::io::Printer::Sub> *)((long)&__range3 + 5));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,
         (allocator<google::protobuf::io::Printer::Sub> *)((long)&__range3 + 5));
  std::allocator<google::protobuf::io::Printer::Sub>::~allocator
            ((allocator<google::protobuf::io::Printer::Sub> *)((long)&__range3 + 5));
  local_de8 = (Sub *)&local_38;
  do {
    local_de8 = local_de8 + -1;
    io::Printer::Sub::~Sub(local_de8);
  } while (local_de8 != &local_6b0);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  io::Printer::Sub::~Sub(&local_9a0);
  std::__cxx11::string::~string((string *)&local_9e8);
  if ((local_a72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a71);
  }
  if ((local_a39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a38);
  }
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator(&local_9c1);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  MessageVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin3.field_1,(cpp *)opts_local,desc_00);
  iVar6 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__begin3.field_1);
  __begin3.ctrl_ = (ctrl_t *)iVar6.field_1;
  __end3.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)iVar6.ctrl_;
  iVar6 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__begin3.field_1);
  iVar1 = iVar6;
  while( true ) {
    __end3.ctrl_ = (ctrl_t *)iVar1.field_1;
    pair = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)iVar1.ctrl_;
    local_e18 = iVar6.field_1;
    pOVar3 = (Options *)iVar6.ctrl_;
    bVar2 = absl::lts_20250127::container_internal::operator!=
                      ((iterator *)&__end3.field_1,(iterator *)&pair);
    if (!bVar2) break;
    ppVar4 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*((iterator *)&__end3.field_1);
    local_af0 = ppVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_bc8,&ppVar4->first,(allocator<char> *)((long)&__range3_1 + 7));
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_ba8,&local_bc8,&local_af0->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::push_back(__return_storage_ptr__,&local_ba8);
    io::Printer::Sub::~Sub(&local_ba8);
    std::__cxx11::string::~string((string *)&local_bc8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++((iterator *)&__end3.field_1);
    iVar1.field_1.slot_ = (slot_type *)__end3.ctrl_;
    iVar1.ctrl_ = (ctrl_t *)pair;
    iVar6.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_2)
         (anon_union_8_1_a8a14541_for_iterator_2)local_e18.slot_;
    iVar6.ctrl_ = (ctrl_t *)pOVar3;
  }
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__begin3.field_1);
  UnknownFieldsVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin3_1.field_1,(cpp *)opts_local,(Descriptor *)opts,pOVar3);
  iVar6 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__begin3_1.field_1);
  __begin3_1.ctrl_ = (ctrl_t *)iVar6.field_1;
  __end3_1.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)iVar6.ctrl_;
  iVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__begin3_1.field_1);
  while( true ) {
    __end3_1.ctrl_ = (ctrl_t *)iVar7.field_1;
    pair_1 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)iVar7.ctrl_;
    bVar2 = absl::lts_20250127::container_internal::operator!=
                      ((iterator *)&__end3_1.field_1,(iterator *)&pair_1);
    if (!bVar2) break;
    ppVar4 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*((iterator *)&__end3_1.field_1);
    local_c20 = ppVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_cf8,&ppVar4->first,&local_cf9);
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_cd8,&local_cf8,&local_c20->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::push_back(__return_storage_ptr__,&local_cd8);
    io::Printer::Sub::~Sub(&local_cd8);
    std::__cxx11::string::~string((string *)&local_cf8);
    std::allocator<char>::~allocator(&local_cf9);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++((iterator *)&__end3_1.field_1);
    iVar7.field_1.slot_ = (slot_type *)__end3_1.ctrl_;
    iVar7.ctrl_ = (ctrl_t *)pair_1;
  }
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__begin3_1.field_1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> ClassVars(const Descriptor* desc, Options opts) {
  std::vector<Sub> vars = {
      {"pkg", Namespace(desc, opts)},
      {"Msg", ClassName(desc, false)},
      {"pkg::Msg", QualifiedClassName(desc, opts)},
      {"pkg.Msg", desc->full_name()},

      // Old-style names, to be removed once all usages are gone in this and
      // other files.
      {"classname", ClassName(desc, false)},
      {"classtype", QualifiedClassName(desc, opts)},
      {"full_name", desc->full_name()},
      {"superclass", SuperClassName(desc, opts)},

      Sub("WeakDescriptorSelfPin",
          UsingImplicitWeakDescriptor(desc->file(), opts)
              ? absl::StrCat(StrongReferenceToType(desc, opts), ";")
              : "")
          .WithSuffix(";"),
  };

  for (auto& pair : MessageVars(desc)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  for (auto& pair : UnknownFieldsVars(desc, opts)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  return vars;
}